

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

Cylinder *
pbrt::Cylinder::Create
          (Transform *renderFromObject,Transform *objectFromRender,bool reverseOrientation,
          ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  Cylinder *pCVar1;
  Float FVar2;
  bool reverseOrientation_local;
  allocator<char> local_65;
  Float zmin;
  string local_60;
  Float phimax;
  Float zmax;
  Float radius;
  Transform *objectFromRender_local;
  Transform *renderFromObject_local;
  Allocator alloc_local;
  
  reverseOrientation_local = reverseOrientation;
  objectFromRender_local = objectFromRender;
  renderFromObject_local = renderFromObject;
  alloc_local = alloc;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"radius",(allocator<char> *)&zmin);
  FVar2 = ParameterDictionary::GetOneFloat(parameters,&local_60,1.0);
  std::__cxx11::string::~string((string *)&local_60);
  radius = FVar2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"zmin",(allocator<char> *)&zmax);
  FVar2 = ParameterDictionary::GetOneFloat(parameters,&local_60,-1.0);
  std::__cxx11::string::~string((string *)&local_60);
  zmin = FVar2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"zmax",(allocator<char> *)&phimax);
  FVar2 = ParameterDictionary::GetOneFloat(parameters,&local_60,1.0);
  std::__cxx11::string::~string((string *)&local_60);
  zmax = FVar2;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"phimax",&local_65);
  FVar2 = ParameterDictionary::GetOneFloat(parameters,&local_60,360.0);
  std::__cxx11::string::~string((string *)&local_60);
  phimax = FVar2;
  pCVar1 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::Cylinder,pbrt::Transform_const*&,pbrt::Transform_const*&,bool&,float&,float&,float&,float&>
                     (&alloc_local,&renderFromObject_local,&objectFromRender_local,
                      &reverseOrientation_local,&radius,&zmin,(float *)&zmax,(float *)&phimax);
  return pCVar1;
}

Assistant:

Cylinder *Cylinder::Create(const Transform *renderFromObject,
                           const Transform *objectFromRender, bool reverseOrientation,
                           const ParameterDictionary &parameters, const FileLoc *loc,
                           Allocator alloc) {
    Float radius = parameters.GetOneFloat("radius", 1);
    Float zmin = parameters.GetOneFloat("zmin", -1);
    Float zmax = parameters.GetOneFloat("zmax", 1);
    Float phimax = parameters.GetOneFloat("phimax", 360);
    return alloc.new_object<Cylinder>(renderFromObject, objectFromRender,
                                      reverseOrientation, radius, zmin, zmax, phimax);
}